

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  size_t __n;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t chunk_len;
  size_t bufsize;
  uchar *in_stack_00000278;
  uint32_t *in_stack_00000280;
  ulong local_20;
  ulong local_18;
  void *local_10;
  
  local_20 = *(ulong *)(in_RDI + 0x60) & 0x3f;
  *(ulong *)(in_RDI + 0x60) = in_RDX + *(long *)(in_RDI + 0x60);
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDX <= *(ulong *)(in_RDI + 0x60)) {
    while (0x40 - local_20 <= local_18) {
      __n = 0x40 - local_20;
      memcpy((void *)(in_RDI + 0x20 + local_20),local_10,__n);
      local_10 = (void *)(__n + (long)local_10);
      local_18 = local_18 - __n;
      secp256k1_sha256_transform(in_stack_00000280,in_stack_00000278);
      local_20 = 0;
    }
    if (local_18 != 0) {
      memcpy((void *)(in_RDI + 0x20 + local_20),local_10,local_18);
    }
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/hash_impl.h"
          ,0x81,"test condition failed: hash->bytes >= len");
  abort();
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    VERIFY_CHECK(hash->bytes >= len);
    while (len >= 64 - bufsize) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(hash->buf + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(hash->buf + bufsize, data, len);
    }
}